

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O1

void __thiscall ParserTestContinuation::Run(ParserTestContinuation *this)

{
  Rule *this_00;
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  *pmVar4;
  EvalString *this_01;
  BindingEnv *this_02;
  string local_68;
  string local_48;
  
  iVar3 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule link\n  command = foo bar $\n    baz\n\nbuild a: link c $\n d e f\n");
  pTVar1 = g_current_test;
  if (iVar3 == g_current_test->assertion_failures_) {
    this_02 = &(this->super_ParserTest).state.bindings_;
    pmVar4 = BindingEnv::GetRules_abi_cxx11_(this_02);
    bVar2 = testing::Test::Check
                      (pTVar1,(pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0xc5,"2u == state.bindings_.GetRules().size()");
    if (bVar2) {
      pmVar4 = BindingEnv::GetRules_abi_cxx11_(this_02);
      pTVar1 = g_current_test;
      this_00 = *(Rule **)((pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 2);
      iVar3 = std::__cxx11::string::compare((char *)this_00);
      testing::Test::Check
                (pTVar1,iVar3 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,199,"\"link\" == rule->name()");
      pTVar1 = g_current_test;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"command","");
      this_01 = Rule::GetBinding(this_00,&local_68);
      EvalString::Serialize_abi_cxx11_(&local_48,this_01);
      iVar3 = std::__cxx11::string::compare((char *)&local_48);
      testing::Test::Check
                (pTVar1,iVar3 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,200,"\"[foo bar baz]\" == rule->GetBinding(\"command\")->Serialize()");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, Continuation) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule link\n"
"  command = foo bar $\n"
"    baz\n"
"\n"
"build a: link c $\n"
" d e f\n"));

  ASSERT_EQ(2u, state.bindings_.GetRules().size());
  const Rule* rule = state.bindings_.GetRules().begin()->second;
  EXPECT_EQ("link", rule->name());
  EXPECT_EQ("[foo bar baz]", rule->GetBinding("command")->Serialize());
}